

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lkalloc.cpp
# Opt level: O2

void lkalloc::free(void *__ptr)

{
  if (custom_free != (code *)0x0) {
    (*custom_free)();
    return;
  }
  ::free(__ptr);
  return;
}

Assistant:

LIBKRIGING_EXPORT
void free(void* mem_ptr) {
#ifdef LIBKRIGING_DEBUG_ALLOC
  static int count = 0;
  ++count;
  // std::cout << "Using lkalloc deallocator " /* << custom_free */ << " (#" << count << ") in " << dllName() << "\n";
  if (seens.find(mem_ptr) == seens.end()) {
    std::cout << "### (#" << count << ") lkalloc allocator has never seen " << mem_ptr << " ##" << std::endl;
    return;
  }
#endif
  if (custom_free) {
    (*custom_free)(mem_ptr);
  } else {
#ifdef _MSC_VER
    return _aligned_free(mem_ptr);
#else
    ::free(mem_ptr);
#endif
  }
#ifdef LIBKRIGING_DEBUG_ALLOC
  seens.erase(mem_ptr);
#endif
}